

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumDotsTexture::Evaluate
          (SpectrumDotsTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  anon_class_24_3_48d30edf func;
  bool bVar1;
  Point2f st;
  SampledSpectrum SVar2;
  Tuple2<pbrt::Vector2,_float> *local_98;
  undefined8 *local_90;
  Tuple3<pbrt::Point3,_float> *local_88;
  undefined8 **ppuStack_80;
  Vector2f **ppVStack_78;
  float afStack_70 [2];
  Tuple2<pbrt::Vector2,_float> local_68;
  undefined8 local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [3];
  int iStack_1c;
  
  local_90 = &local_60;
  ppuStack_80 = &local_90;
  local_98 = &local_68;
  local_60 = 0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_88 = local_58;
  ppVStack_78 = (Vector2f **)&local_98;
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[2].z = ctx.dvdy;
  iStack_1c = ctx.faceIndex;
  func.dstdx = (Vector2f **)ppuStack_80;
  func.ctx = (TextureEvalContext *)local_88;
  func.dstdy = ppVStack_78;
  st = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
       ::
       Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                 ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   *)this,func);
  bVar1 = InsidePolkaDot(st);
  if (bVar1) {
    local_90 = (undefined8 *)
               (this->insideDot).
               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
  }
  else {
    local_90 = (undefined8 *)
               (this->outsideDot).
               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
  }
  aTStack_40[2].z = ctx.dvdy;
  iStack_1c = ctx.faceIndex;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  afStack_70[0] = lambda.pdf.values[2];
  afStack_70[1] = lambda.pdf.values[3];
  ppVStack_78 = (Vector2f **)lambda.pdf.values._0_8_;
  ppuStack_80 = (undefined8 **)lambda.lambda.values._8_8_;
  local_88 = (Tuple3<pbrt::Point3,_float> *)lambda.lambda.values._0_8_;
  SVar2 = DispatchSplit<10>::operator()((DispatchSplit<10> *)&local_98);
  return (array<float,_4>)(array<float,_4>)SVar2;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return InsidePolkaDot(st) ? insideDot.Evaluate(ctx, lambda)
                                  : outsideDot.Evaluate(ctx, lambda);
    }